

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void amrex::anon_unknown_12::read_file
               (char *fname,
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  istream *piVar6;
  ulong uVar7;
  ostream *poVar8;
  bool bVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var17;
  _Bit_iterator _Var18;
  string filestring_cxx;
  vector<bool,_std::allocator<bool>_> valid_region;
  vector<bool,_std::allocator<bool>_> has_true;
  string filename;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  char *b;
  regex endif_regex;
  regex else_regex;
  regex elif_regex;
  regex if_regex;
  ostringstream os_cxx;
  ostringstream os_fortran;
  istringstream is;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_630;
  ulong local_628;
  undefined1 local_620 [16];
  vector<bool,_std::allocator<bool>_> local_610;
  undefined1 local_5e8;
  undefined7 uStack_5e7;
  long local_5e0;
  long local_5d8 [2];
  vector<bool,_std::allocator<bool>_> local_5c8;
  char *local_5a0;
  string local_598;
  Vector<char,_std::allocator<char>_> local_578;
  smatch local_558;
  ulong local_538;
  char *local_530;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *local_528;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_520;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_500;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_4e0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_4c0;
  long *local_4a0 [2];
  long local_490 [12];
  ios_base local_430 [264];
  allocator local_328 [112];
  ios_base local_2b8 [264];
  MPI_Comm local_1b0;
  undefined4 uStack_1ac;
  ios_base local_138 [264];
  
  if ((fname != (char *)0x0) && (*fname != '\0')) {
    local_578.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (char *)0x0;
    local_578.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_578.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    sVar5 = strlen(fname);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,fname,fname + sVar5);
    local_1b0 = ParallelDescriptor::m_comm;
    ParallelDescriptor::ReadAndBcastFile(&local_598,&local_578,true,&local_1b0);
    std::__cxx11::string::string
              ((string *)local_4a0,
               local_578.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,local_328);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1b0,(string *)local_4a0,_S_in);
    if (local_4a0[0] != local_490) {
      operator_delete(local_4a0[0],local_490[0] + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0,_S_out);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328,_S_out);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_4c0,
               "^\\s*#\\s*if\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$",
               0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_4e0,
               "^\\s*#\\s*elif\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$",
               0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_500,"^\\s*#\\s*else\\s*$",0x10);
    local_528 = tab;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_520,"^\\s*#\\s*endif\\s*$",0x10);
    local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_630._M_current = local_620;
    local_628 = 0;
    local_620[0] = '\0';
    bVar9 = false;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_1ac,local_1b0) + -0x18) +
                              (char)(istringstream *)&local_1b0);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_1b0,(string *)&local_630,cVar2);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      local_558.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_558._M_begin._M_current = (char *)0x0;
      local_558.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_558.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (local_630,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_630._M_current + local_628),&local_558,&local_4c0,0);
      if (bVar3) {
        bVar3 = anon_unknown_0::isTrue(&local_558);
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_610,bVar3);
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_5c8,bVar3);
      }
      else {
        bVar3 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_630,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_630._M_current + local_628),&local_558,&local_4e0,0);
        if (bVar3) {
          uVar14 = (ulong)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
          uVar7 = (ulong)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  0x3e;
          if (-1 < (long)uVar14) {
            uVar7 = uVar14;
          }
          if ((local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_p
               [((long)uVar7 >> 6) +
                ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar14 & 0x3f) & 1) == 0) {
            bVar3 = anon_unknown_0::isTrue(&local_558);
            uVar14 = (ulong)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                     1;
            uVar7 = (ulong)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    0x3e;
            if (-1 < (long)uVar14) {
              uVar7 = uVar14;
            }
            lVar10 = (long)uVar7 >> 6;
            uVar7 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
            uVar14 = 1L << ((byte)uVar14 & 0x3f);
            if (bVar3) {
              uVar14 = uVar14 | local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                                [lVar10 + (uVar7 - 1)];
            }
            else {
              uVar14 = ~uVar14 & local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                                 [lVar10 + (uVar7 - 1)];
            }
            local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p[lVar10 + (uVar7 - 1)] = uVar14;
            uVar14 = (ulong)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                     1;
            uVar7 = (ulong)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    0x3e;
            if (-1 < (long)uVar14) {
              uVar7 = uVar14;
            }
            uVar15 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
            uVar14 = 1L << ((byte)uVar14 & 0x3f);
            if (bVar3) {
              local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p[((long)uVar7 >> 6) + (uVar15 - 1)] =
                   local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                   [((long)uVar7 >> 6) + (uVar15 - 1)] | uVar14;
            }
            else {
              local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p[((long)uVar7 >> 6) + (uVar15 - 1)] =
                   local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                   [((long)uVar7 >> 6) + (uVar15 - 1)] & ~uVar14;
            }
          }
          else {
            uVar14 = (ulong)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                     1;
            uVar7 = (ulong)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    0x3e;
            if (-1 < (long)uVar14) {
              uVar7 = uVar14;
            }
            bVar1 = (byte)uVar14 & 0x3f;
            local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p
            [((long)uVar7 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                 = local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                   [((long)uVar7 >> 6) +
                    ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                   (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
          }
        }
        else {
          bVar3 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (local_630,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(local_630._M_current + local_628),&local_558,&local_500,0);
          if (bVar3) {
            uVar14 = (ulong)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                     1;
            uVar7 = (ulong)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    0x3e;
            if (-1 < (long)uVar14) {
              uVar7 = uVar14;
            }
            uVar15 = (ulong)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                     1;
            uVar13 = (ulong)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     0x3e;
            if (-1 < (long)uVar15) {
              uVar13 = uVar15;
            }
            uVar16 = (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001);
            uVar15 = 1L << ((byte)uVar15 & 0x3f);
            if ((local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                 [((long)uVar7 >> 6) +
                  ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar14 & 0x3f) & 1) == 0) {
              local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p[((long)uVar13 >> 6) + (uVar16 - 1)] =
                   local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                   [((long)uVar13 >> 6) + (uVar16 - 1)] | uVar15;
            }
            else {
              local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p[((long)uVar13 >> 6) + (uVar16 - 1)] =
                   local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                   [((long)uVar13 >> 6) + (uVar16 - 1)] & ~uVar15;
            }
          }
          else {
            bVar3 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (local_630,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(local_630._M_current + local_628),&local_558,&local_520,0);
            if (bVar3) {
              bVar3 = local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
              local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset =
                   local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
              if (bVar3) {
                local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
                local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                     local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
              }
              bVar3 = local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
              local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset =
                   local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
              if (bVar3) {
                local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
                local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                     local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
              }
            }
            else {
              local_5e8 = 0;
              _Var18 = std::
                       __find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                                 (local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                                  local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                                  local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                  _M_offset);
              if ((_Var18.super__Bit_iterator_base._M_p ==
                   local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
                 (_Var18.super__Bit_iterator_base._M_offset ==
                  local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) {
                local_5a0 = local_630._M_current + local_628;
                local_530 = local_630._M_current;
                local_538 = local_628;
                _Var17._M_current = local_630._M_current;
                if (0 < (long)local_628 >> 2) {
                  _Var17._M_current = local_630._M_current + (local_628 & 0xfffffffffffffffc);
                  lVar10 = ((long)local_628 >> 2) + 1;
                  pcVar11 = local_630._M_current + 3;
                  do {
                    iVar4 = isspace((int)pcVar11[-3]);
                    if (iVar4 == 0) {
                      pcVar11 = pcVar11 + -3;
                      goto LAB_00529103;
                    }
                    iVar4 = isspace((int)pcVar11[-2]);
                    if (iVar4 == 0) {
                      pcVar11 = pcVar11 + -2;
                      goto LAB_00529103;
                    }
                    iVar4 = isspace((int)pcVar11[-1]);
                    if (iVar4 == 0) {
                      pcVar11 = pcVar11 + -1;
                      goto LAB_00529103;
                    }
                    iVar4 = isspace((int)*pcVar11);
                    if (iVar4 == 0) goto LAB_00529103;
                    lVar10 = lVar10 + -1;
                    pcVar11 = pcVar11 + 4;
                  } while (1 < lVar10);
                }
                lVar10 = (long)local_5a0 - (long)_Var17._M_current;
                pcVar12 = local_5a0;
                if (lVar10 == 1) {
LAB_005290f1:
                  iVar4 = isspace((int)*_Var17._M_current);
                  pcVar11 = _Var17._M_current;
                  if (iVar4 != 0) {
                    pcVar11 = pcVar12;
                  }
                }
                else if (lVar10 == 2) {
LAB_00529045:
                  pcVar12 = local_5a0;
                  iVar4 = isspace((int)*_Var17._M_current);
                  pcVar11 = _Var17._M_current;
                  if (iVar4 != 0) {
                    _Var17._M_current = _Var17._M_current + 1;
                    goto LAB_005290f1;
                  }
                }
                else {
                  pcVar11 = local_5a0;
                  if ((lVar10 == 3) &&
                     (iVar4 = isspace((int)*_Var17._M_current), pcVar11 = _Var17._M_current,
                     iVar4 != 0)) {
                    _Var17._M_current = _Var17._M_current + 1;
                    goto LAB_00529045;
                  }
                }
LAB_00529103:
                if (bVar9) {
                  std::__cxx11::string::find((char)&local_630,0x21);
                  std::__cxx11::string::substr((ulong)&local_5e8,(ulong)&local_630);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_328,(char *)CONCAT71(uStack_5e7,local_5e8),
                                      local_5e0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  if ((long *)CONCAT71(uStack_5e7,local_5e8) != local_5d8) {
                    operator_delete((long *)CONCAT71(uStack_5e7,local_5e8),local_5d8[0] + 1);
                  }
                  if ((pcVar11 != local_630._M_current + local_628) && (*pcVar11 == '/')) {
                    bVar9 = false;
                  }
                }
                else if ((pcVar11 == local_5a0) || (*pcVar11 != '&')) {
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_4a0,local_530,local_538);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                }
                else {
                  std::__cxx11::string::find((char)&local_630,0x21);
                  std::__cxx11::string::substr((ulong)&local_5e8,(ulong)&local_630);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_328,(char *)CONCAT71(uStack_5e7,local_5e8),
                                      local_5e0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  if ((long *)CONCAT71(uStack_5e7,local_5e8) != local_5d8) {
                    operator_delete((long *)CONCAT71(uStack_5e7,local_5e8),local_5d8[0] + 1);
                  }
                  bVar9 = true;
                }
              }
            }
          }
        }
      }
      if (local_558.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_558.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_558.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((pointer)local_630._M_current != (pointer)local_620) {
      operator_delete(local_630._M_current,CONCAT71(local_620._1_7_,local_620[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    local_558.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_630._M_current;
    bldTable((char **)&local_558,local_528);
    if ((pointer)local_630._M_current != (pointer)local_620) {
      operator_delete(local_630._M_current,CONCAT71(local_620._1_7_,local_620[0]) + 1);
    }
    if (local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_5c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_610.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_520);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_500);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_4e0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_4c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base(local_2b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
    std::ios_base::~ios_base(local_430);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    if (local_578.super_vector<char,_std::allocator<char>_>.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
        (char *)0x0) {
      operator_delete(local_578.super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_578.super_vector<char,_std::allocator<char>_>.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_578.super_vector<char,_std::allocator<char>_>.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

static void
read_file (const char*                     fname,
           std::list<ParmParse::PP_entry>& tab)
{
    //
    // Space for input file if it exists.
    //
    if ( fname != 0 && fname[0] != 0 )
    {
        Vector<char> fileCharPtr;
        std::string filename = fname;
        ParallelDescriptor::ReadAndBcastFile(filename, fileCharPtr);

        std::istringstream is(fileCharPtr.data());
        std::ostringstream os_cxx(std::ios_base::out);
        std::ostringstream os_fortran(std::ios_base::out);
        bool fortran_namelist = false;
        std::regex if_regex("^\\s*#\\s*if\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$");
        std::regex elif_regex("^\\s*#\\s*elif\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$");
        std::regex else_regex("^\\s*#\\s*else\\s*$");
        std::regex endif_regex("^\\s*#\\s*endif\\s*$");
        std::vector<bool> valid_region;  // Keep this block or not?
        std::vector<bool> has_true;      // Has previous if/elif ever been true?
        for (std::string line; std::getline(is, line); ) {
            std::smatch sm;
            if (std::regex_match(line, sm, if_regex)) {
                bool r = isTrue(sm);
                valid_region.push_back(r);
                has_true.push_back(r);
                continue;
            } else if (std::regex_match(line, sm, elif_regex)) {
                if (has_true.back() == false) {
                    // If none of the previous if/elif is true
                    bool r = isTrue(sm);
                    valid_region.back() = r;
                    has_true.back() = r;
                } else {
                    // If any of the previous if/elif is true
                    valid_region.back() = false;
                }
                continue;
            } else if (std::regex_match(line, sm, else_regex)) {
                if (has_true.back() == false) {
                    // If none of the previous if/elif is true,
                    valid_region.back() = true;
                } else {
                    valid_region.back() = false;
                }
                continue;
            } else if (std::regex_match(line, sm, endif_regex)) {
                valid_region.pop_back();
                has_true.pop_back();
                continue;
            }

            if (std::find(std::begin(valid_region), std::end(valid_region), false)
                != std::end(valid_region)) {
                continue;
            }

            auto r = std::find_if(std::begin(line), std::end(line),
                                  [](int c) -> bool { return !std::isspace(c); });
            if (fortran_namelist) { // already inside fortran namelist
                // os_fortran << line << "\n";
                // pgi and ibm do not like `\n`.  We strip comments for them too.
                os_fortran << line.substr(0, line.find('!')) << " ";
                if (r != std::end(line) && *r == '/') {
                    fortran_namelist = false; // end of Fortran namelist
                }
            } else if (r != std::end(line) && *r == '&') {
                // os_fortran << line << "\n";
                // pgi and ibm do not like `\n`.  We strip comments for them too.
                os_fortran << line.substr(0, line.find('!')) << " ";
                fortran_namelist = true;  // begin of Fortran namelist
            } else {
                os_cxx << line << "\n";
            }
        }

        std::string filestring_cxx = os_cxx.str();
        const char* b = filestring_cxx.c_str();
        bldTable(b, tab);

#if !defined(BL_NO_FORT)
        std::string filestring_fortran = os_fortran.str();
        amrex_init_namelist(filestring_fortran.c_str());
#endif
    }
}